

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserPass.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::UserPass::updatePassword
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,UserPass *this,Path *path,Parameters *parameters)

{
  Client *client;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Path local_88;
  Url local_68;
  string local_48;
  
  client = *(Client **)this;
  Vault::operator+(&local_48,"users/",path);
  std::operator+(&local_a8,&local_48,"/password");
  local_88.value_._M_dataplus._M_p = (pointer)&local_88.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    local_88.value_.field_2._8_8_ = local_a8.field_2._8_8_;
  }
  else {
    local_88.value_._M_dataplus._M_p = local_a8._M_dataplus._M_p;
  }
  local_88.value_._M_string_length = local_a8._M_string_length;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  getUrl(&local_68,this,&local_88);
  HttpConsumer::post(__return_storage_ptr__,client,&local_68,parameters);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::UserPass::updatePassword(const Path &path,
                                const Parameters &parameters) {
  return HttpConsumer::post(
      client_, getUrl(Path{"users/" + path + "/password"}), parameters);
}